

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

size_t __thiscall
ot::commissioner::CommissionerApp::EraseAllJoiners(CommissionerApp *this,JoinerType aJoinerType)

{
  iterator __position;
  size_t sVar1;
  
  __position._M_node = (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar1 = 0;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header) {
    if (__position._M_node[1]._M_color == aJoinerType) {
      sVar1 = sVar1 + 1;
      __position = std::
                   _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                   ::erase_abi_cxx11_((_Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                                       *)&this->mJoiners,__position);
    }
    else {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
  }
  return sVar1;
}

Assistant:

size_t CommissionerApp::EraseAllJoiners(JoinerType aJoinerType)
{
    size_t count  = 0;
    auto   joiner = mJoiners.begin();
    while (joiner != mJoiners.end())
    {
        if (joiner->first.mType == aJoinerType)
        {
            ++count;
            joiner = mJoiners.erase(joiner);
        }
        else
        {
            ++joiner;
        }
    }
    return count;
}